

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyle,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcSurfaceStyle *in;
  
  in = (IfcSurfaceStyle *)operator_new(0x98);
  *(undefined8 *)&in->field_0x88 = 0;
  *(char **)&in->field_0x90 = "IfcSurfaceStyle";
  (in->super_IfcPresentationStyle).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined1 **)
   &(in->super_IfcPresentationStyle).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.field_0x10 =
       &(in->super_IfcPresentationStyle).
        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.field_0x20;
  *(undefined8 *)
   &(in->super_IfcPresentationStyle).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.field_0x18 = 0;
  (in->super_IfcPresentationStyle).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.field_0x20 = 0;
  (in->super_IfcPresentationStyle).field_0x30 = 0;
  *(undefined8 *)&(in->super_IfcPresentationStyle).field_0x40 = 0;
  (in->super_IfcPresentationStyle).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcSurfaceStyle_00927b20;
  *(undefined ***)&in->field_0x80 = &PTR__IfcSurfaceStyle_00927b70;
  *(undefined ***)&(in->super_IfcPresentationStyle).field_0x38 = &PTR__IfcSurfaceStyle_00927b48;
  *(undefined1 **)&(in->super_IfcPresentationStyle).field_0x48 = &in->field_0x58;
  *(undefined8 *)&in->field_0x50 = 0;
  in->field_0x58 = 0;
  (in->Styles).
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in->Styles).
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in->Styles).
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcSurfaceStyle>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcPresentationStyle).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcPresentationStyle).
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }